

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_mapentry(upb_encstate *e,uint32_t number,upb_MiniTable *layout,upb_MapEntry *ent)

{
  char *pcVar1;
  upb_MiniTableField *f;
  upb_MiniTableField *f_00;
  char *pcVar2;
  size_t size;
  size_t pre_len;
  upb_MiniTableField *val_field;
  upb_MiniTableField *key_field;
  upb_MapEntry *ent_local;
  upb_MiniTable *layout_local;
  uint32_t number_local;
  upb_encstate *e_local;
  
  f = upb_MiniTable_MapKey(layout);
  f_00 = upb_MiniTable_MapValue(layout);
  pcVar2 = e->limit;
  pcVar1 = e->ptr;
  encode_scalar(e,&ent->v,layout->subs_dont_copy_me__upb_internal_use_only,f_00);
  encode_scalar(e,&ent->k,layout->subs_dont_copy_me__upb_internal_use_only,f);
  pcVar2 = e->limit + (-((long)pcVar2 - (long)pcVar1) - (long)e->ptr);
  if ((pcVar2 < (char *)0x80) && (e->ptr != e->buf)) {
    e->ptr = e->ptr + -1;
    *e->ptr = (char)pcVar2;
  }
  else {
    encode_longvarint(e,(uint64_t)pcVar2);
  }
  encode_tag(e,number,'\x02');
  return;
}

Assistant:

static void encode_mapentry(upb_encstate* e, uint32_t number,
                            const upb_MiniTable* layout,
                            const upb_MapEntry* ent) {
  const upb_MiniTableField* key_field = upb_MiniTable_MapKey(layout);
  const upb_MiniTableField* val_field = upb_MiniTable_MapValue(layout);
  size_t pre_len = e->limit - e->ptr;
  size_t size;
  encode_scalar(e, &ent->v, layout->UPB_PRIVATE(subs), val_field);
  encode_scalar(e, &ent->k, layout->UPB_PRIVATE(subs), key_field);
  size = (e->limit - e->ptr) - pre_len;
  encode_varint(e, size);
  encode_tag(e, number, kUpb_WireType_Delimited);
}